

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int ON_FontList::CompareQuartetName(ON_Font **lhs,ON_Font **rhs)

{
  int iVar1;
  wchar_t *string1;
  wchar_t *string2;
  undefined1 local_20 [16];
  
  iVar1 = 0;
  if (((lhs != rhs) && (iVar1 = 1, lhs != (ON_Font **)0x0)) && (iVar1 = -1, rhs != (ON_Font **)0x0))
  {
    iVar1 = 0;
    if (((*lhs != *rhs) && (iVar1 = 1, *lhs != (ON_Font *)0x0)) &&
       (iVar1 = -1, *rhs != (ON_Font *)0x0)) {
      ON_Font::QuartetName((ON_Font *)(local_20 + 8));
      string1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_20 + 8));
      ON_Font::QuartetName((ON_Font *)local_20);
      string2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_20);
      iVar1 = ON_wString::CompareOrdinal(string1,string2,true);
      ON_wString::~ON_wString((ON_wString *)local_20);
      ON_wString::~ON_wString((ON_wString *)(local_20 + 8));
    }
  }
  return iVar1;
}

Assistant:

int ON_FontList::CompareQuartetName(ON_Font const* const* lhs, ON_Font const* const* rhs)
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);
  return ON_wString::CompareOrdinal(
    lhs_font->QuartetName(), 
    rhs_font->QuartetName(),
    true
  );
}